

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall asl::InetAddress::InetAddress(InetAddress *this,Type t)

{
  byte *__s;
  int local_18;
  int n;
  Type t_local;
  InetAddress *this_local;
  
  Array<unsigned_char>::Array(&this->_data);
  this->_type = t;
  local_18 = 0;
  if (t == IPv4) {
    local_18 = 0x10;
  }
  else if (t == IPv6) {
    local_18 = 0x1c;
  }
  else if (t == LOCAL) {
    local_18 = 0x6e;
  }
  resize(this,local_18);
  __s = ptr(this);
  memset(__s,0,(long)local_18);
  return;
}

Assistant:

InetAddress::InetAddress(InetAddress::Type t)
{
	_type = t;
	int n = 0;
	switch (t)
	{
	case IPv4: n = sizeof(sockaddr_in); break;
	case IPv6: n = sizeof(sockaddr_in6); break;
#ifdef ASL_SOCKET_LOCAL
	case LOCAL: n = sizeof(sockaddr_un); break;
#endif
	default: ;
	}
	resize(n);
	memset(ptr(), 0, n);
}